

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlDocDump(FILE *f,xmlDocPtr cur)

{
  xmlChar *encoding_00;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf_00;
  int ret;
  char *encoding;
  xmlCharEncodingHandlerPtr handler;
  xmlOutputBufferPtr buf;
  xmlDocPtr cur_local;
  FILE *f_local;
  
  xmlInitParser();
  if ((cur == (xmlDocPtr)0x0) || (f == (FILE *)0x0)) {
    f_local._4_4_ = -1;
  }
  else {
    encoding_00 = htmlGetMetaEncoding(cur);
    encoder = htmlFindOutputEncoder((char *)encoding_00);
    buf_00 = xmlOutputBufferCreateFile(f,encoder);
    if (buf_00 == (xmlOutputBufferPtr)0x0) {
      f_local._4_4_ = -1;
    }
    else {
      htmlDocContentDumpOutput(buf_00,cur,(char *)0x0);
      f_local._4_4_ = xmlOutputBufferClose(buf_00);
    }
  }
  return f_local._4_4_;
}

Assistant:

int
htmlDocDump(FILE *f, xmlDocPtr cur) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;
    int ret;

    xmlInitParser();

    if ((cur == NULL) || (f == NULL)) {
	return(-1);
    }

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlOutputBufferCreateFile(f, handler);
    if (buf == NULL)
        return(-1);
    htmlDocContentDumpOutput(buf, cur, NULL);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}